

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DFireFlicker::DFireFlicker(DFireFlicker *this,sector_t *sector)

{
  short sVar1;
  int iVar2;
  int iVar3;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f3368;
  sVar1 = sector->lightlevel;
  this->m_MaxLight = (int)sVar1;
  iVar2 = sector_t::FindMinSurroundingLight(sector,(int)sVar1);
  iVar3 = 0x7fef;
  if (iVar2 < 0x7fef) {
    iVar3 = iVar2;
  }
  iVar2 = -0x8010;
  if (-0x8010 < iVar3) {
    iVar2 = iVar3;
  }
  this->m_MinLight = (int)(short)((short)iVar2 + 0x10);
  this->m_Count = 4;
  return;
}

Assistant:

DFireFlicker::DFireFlicker (sector_t *sector)
	: DLighting (sector)
{
	m_MaxLight = sector->lightlevel;
	m_MinLight = sector_t::ClampLight(sector->FindMinSurroundingLight(sector->lightlevel) + 16);
	m_Count = 4;
}